

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O3

string * __thiscall SInputFile::InitStr_abi_cxx11_(string *__return_storage_ptr__,SInputFile *this)

{
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var1;
  _List _Var2;
  char cVar3;
  int iVar4;
  uint uVar5;
  path *ppVar6;
  long lVar7;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> *p_Var8;
  path *ppVar9;
  path canonical;
  path relative;
  undefined1 local_68 [32];
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> local_48;
  path local_40;
  
  ppVar6 = (path *)local_68;
  ppVar9 = (path *)local_68;
  cVar3 = std::filesystem::status(&this->full);
  if ((cVar3 == '\0') || (cVar3 == -1)) {
    std::filesystem::__cxx11::path::lexically_normal();
  }
  else {
    std::filesystem::canonical((path *)local_68);
  }
  if (Options::FileVerbosity != 2) {
    if (Options::FileVerbosity != 1) {
      if (local_68._8_8_ == 0) {
LAB_0012a182:
        std::filesystem::__cxx11::path::path(&local_40);
      }
      else {
        uVar5 = (uint)local_48._M_head_impl;
        if ((~(byte)local_48._M_head_impl & 3) != 0) {
          if ((((ulong)local_48._M_head_impl & 3) == 0) &&
             (*(char *)(local_68._0_8_ + (local_68._8_8_ - 1)) != '/')) {
            if (((ulong)local_48._M_head_impl & 3) == 0) {
              lVar7 = std::filesystem::__cxx11::path::_List::end();
              ppVar9 = (path *)(lVar7 + -0x30);
              p_Var8 = (_Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> *)
                       (lVar7 + -0x10);
              if (((ulong)local_48._M_head_impl & 3) != 0) {
                p_Var8 = &local_48;
                ppVar9 = (path *)local_68;
              }
              uVar5 = (uint)p_Var8->_M_head_impl;
            }
            ppVar6 = ppVar9;
            if ((~uVar5 & 3) == 0) goto LAB_0012a147;
          }
          goto LAB_0012a182;
        }
LAB_0012a147:
        std::filesystem::__cxx11::path::path(&local_40,ppVar6);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,local_40._M_pathname._M_dataplus._M_p,
                 local_40._M_pathname._M_dataplus._M_p + local_40._M_pathname._M_string_length);
      std::filesystem::__cxx11::path::~path(&local_40);
      goto LAB_0012a1b2;
    }
    std::filesystem::__cxx11::path::lexically_proximate(&local_40);
    ppVar9 = &local_40;
    if (((ulong)local_40._M_cmpts._M_impl._M_t.
                super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                ._M_t.
                super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                _M_head_impl & 3) == 0) {
      ppVar6 = (path *)std::filesystem::__cxx11::path::_List::begin();
      ppVar9 = &local_40;
      if (((ulong)local_40._M_cmpts._M_impl._M_t.
                  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                  _M_head_impl & 3) == 0) {
        ppVar9 = ppVar6;
      }
    }
    iVar4 = std::filesystem::__cxx11::path::compare(ppVar9);
    if (iVar4 != 0) {
      std::__cxx11::string::operator=((string *)local_68,(string *)&local_40);
      _Var2._M_impl._M_t.
      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
           local_40._M_cmpts._M_impl._M_t.
           super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
           ._M_t.
           super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
           .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
           _M_head_impl;
      _Var1._M_head_impl = local_48._M_head_impl;
      local_40._M_cmpts._M_impl._M_t.
      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
           (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
              )0x0;
      local_48._M_head_impl =
           (_Impl *)_Var2._M_impl._M_t.
                    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                    _M_head_impl;
      if (_Var1._M_head_impl != (_Impl *)0x0) {
        std::filesystem::__cxx11::path::_List::_Impl_deleter::operator()
                  ((_Impl_deleter *)&local_48,_Var1._M_head_impl);
      }
      std::filesystem::__cxx11::path::clear(&local_40);
    }
    std::filesystem::__cxx11::path::~path(&local_40);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_68._0_8_,
             (pointer)(local_68._0_8_ + local_68._8_8_));
LAB_0012a1b2:
  std::filesystem::__cxx11::path::~path((path *)local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string SInputFile::InitStr() {
	auto canonical = std::filesystem::exists(full) ? std::filesystem::canonical(full) : full.lexically_normal();
	switch(Options::FileVerbosity) {
		case Options::FNAME_LAUNCH_REL:
			{	// try relative to LaunchDirectory, if outside (starts with "../") then keep absolute
				auto relative = canonical.lexically_proximate(LaunchDirectory);
				if (relative.begin()->compare(DOUBLE_DOT_PARENT)) canonical = std::move(relative);
			}
			[[fallthrough]];
		case Options::FNAME_ABSOLUTE:
			return SJ_force_slash(canonical).string();
		case Options::FNAME_BASE:
		default:
			return canonical.filename().string();
	}
}